

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-interp.cc
# Opt level: O0

Result __thiscall
wabt::interp::anon_unknown_1::BinaryReaderInterp::OnBrExpr(BinaryReaderInterp *this,Index depth)

{
  Index index;
  bool bVar1;
  Location local_c0;
  Var local_a0;
  Location local_58;
  Enum local_34;
  Enum local_30;
  Enum local_2c;
  Index local_28;
  Index local_24;
  Index catch_drop_count;
  Index keep_count;
  Index drop_count;
  Index depth_local;
  BinaryReaderInterp *this_local;
  
  keep_count = depth;
  _drop_count = this;
  local_2c = (Enum)GetBrDropKeepCount(this,depth,&catch_drop_count,&local_24);
  bVar1 = Failed((Result)local_2c);
  if (bVar1) {
    Result::Result((Result *)((long)&this_local + 4),Error);
  }
  else {
    local_30 = (Enum)SharedValidator::GetCatchCount(&this->validator_,keep_count,&local_28);
    bVar1 = Failed((Result)local_30);
    if (bVar1) {
      Result::Result((Result *)((long)&this_local + 4),Error);
    }
    else {
      GetLocation(&local_58,this);
      index = keep_count;
      GetLocation(&local_c0,this);
      Var::Var(&local_a0,index,&local_c0);
      local_34 = (Enum)SharedValidator::OnBr(&this->validator_,&local_58,&local_a0);
      bVar1 = Failed((Result)local_34);
      Var::~Var(&local_a0);
      if (bVar1) {
        Result::Result((Result *)((long)&this_local + 4),Error);
      }
      else {
        EmitBr(this,keep_count,catch_drop_count,local_24,local_28);
        Result::Result((Result *)((long)&this_local + 4),Ok);
      }
    }
  }
  return (Result)this_local._4_4_;
}

Assistant:

Result BinaryReaderInterp::OnBrExpr(Index depth) {
  Index drop_count, keep_count, catch_drop_count;
  CHECK_RESULT(GetBrDropKeepCount(depth, &drop_count, &keep_count));
  CHECK_RESULT(validator_.GetCatchCount(depth, &catch_drop_count));
  CHECK_RESULT(validator_.OnBr(GetLocation(), Var(depth, GetLocation())));
  EmitBr(depth, drop_count, keep_count, catch_drop_count);
  return Result::Ok;
}